

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerService.cpp
# Opt level: O0

byte4 __thiscall
ServerService::readAck(ServerService *this,int socketFD,sockaddr_storage clientDetails)

{
  ssize_t sVar1;
  ServerSegment *pSVar2;
  ServerSegment *temp;
  byte *pbStack_28;
  socklen_t clientLength;
  byte *buffer;
  ServerService *pSStack_18;
  int socketFD_local;
  ServerService *this_local;
  
  buffer._4_4_ = socketFD;
  pSStack_18 = this;
  pbStack_28 = (byte *)calloc(0x5c0,1);
  temp._4_4_ = 0x80;
  memset(pbStack_28,0,0x5c0);
  sVar1 = recvfrom(buffer._4_4_,pbStack_28,0x5c0,0,(sockaddr *)&clientDetails,
                   (socklen_t *)((long)&temp + 4));
  if (sVar1 == 0) {
    free(pbStack_28);
  }
  else {
    pSVar2 = parseRequest(this,pbStack_28);
    if (pSVar2->ackFlag == 'Y') {
      free(pbStack_28);
      return pSVar2->ackNumber;
    }
    if (pSVar2 != (ServerSegment *)0x0) {
      operator_delete(pSVar2,0x18);
    }
  }
  return 0;
}

Assistant:

byte4 ServerService::readAck(int socketFD, struct sockaddr_storage clientDetails) {
    byte *buffer = (byte *) calloc(MTU, sizeof(byte));
    socklen_t clientLength = sizeof(clientDetails);
    memset(buffer, 0, MTU);

    if (recvfrom(socketFD, buffer, MTU, 0, (struct sockaddr *) &clientDetails, &clientLength)) {
        ServerSegment *temp = parseRequest(buffer);
        if (temp->ackFlag == TRUE) {
            free(buffer);
            return temp->ackNumber;
        }
        delete temp;
    } else {
        //若 ack 标志位为 FALSE 则直接丢弃
        free(buffer);
    }
    return 0;
}